

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O3

_Bool do_cmd_disarm_chest(object *obj)

{
  _Bool _Var1;
  uint32_t uVar2;
  chest_trap *pcVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  char *fmt;
  int iVar7;
  
  iVar6 = (player->state).skills[0];
  iVar7 = iVar6;
  if (chest_traps != (chest_trap *)0x0) {
    bVar4 = 0;
    bVar5 = 0;
    pcVar3 = chest_traps;
    do {
      if ((pcVar3->pval & (int)obj->pval) != 0) {
        bVar4 = bVar4 | pcVar3->magic;
        bVar5 = bVar5 | pcVar3->magic ^ 1U;
      }
      pcVar3 = pcVar3->next;
    } while (pcVar3 != (chest_trap *)0x0);
    if (((bVar4 & 1) != 0) && (iVar7 = (player->state).skills[1], (bVar5 & 1) != 0)) {
      iVar7 = (iVar7 + iVar6) / 2;
    }
  }
  if ((player->timed[2] != 0) || (_Var1 = no_light(player), _Var1)) {
    iVar7 = iVar7 / 10;
  }
  if ((player->timed[4] != 0) || (player->timed[6] != 0)) {
    iVar7 = iVar7 / 10;
  }
  iVar7 = iVar7 - obj->pval;
  iVar6 = 2;
  if (2 < iVar7) {
    iVar6 = iVar7;
  }
  if ((obj->known->pval == 0) || (_Var1 = ignore_item_ok(player,obj), _Var1)) {
    fmt = "I don\'t see any traps.";
  }
  else {
    _Var1 = tval_is_chest(obj);
    if ((_Var1) && (1 < obj->pval)) {
      uVar2 = Rand_div(100);
      if ((int)uVar2 < iVar6) {
        msgt(0x58,"You have disarmed the chest.");
        player_exp_gain(player,(int)obj->pval);
        obj->pval = -obj->pval;
        return false;
      }
      uVar2 = Rand_div(100);
      if ((int)uVar2 < iVar6) {
        event_signal(EVENT_INPUT_FLUSH);
        msg("You failed to disarm the chest.");
        return true;
      }
      _Var1 = player_is_trapsafe(player);
      if (_Var1) {
        _Var1 = player_of_has(player,L'$');
        if (_Var1) {
          equip_learn_flag(player,L'$');
        }
        return false;
      }
      msg("You set off a trap!");
      chest_trap(obj);
      return false;
    }
    fmt = "The chest is not trapped.";
  }
  msg(fmt);
  return false;
}

Assistant:

bool do_cmd_disarm_chest(struct object *obj)
{
	int skill = player->state.skills[SKILL_DISARM_PHYS], diff;
	struct chest_trap *traps;
	bool physical = false;
	bool magic = false;
	bool more = false;

	/* Check whether the traps are magic, physical or both */
	for (traps = chest_traps; traps; traps = traps->next) {
		if (!(traps->pval & obj->pval)) continue;
		if (traps->magic) {
			magic = true;
		} else {
			physical = true;
		}
	}

	/* Physical disarming is the default, if there are magic traps we adjust */ 
	if (magic) {
		if (physical) {
			skill = (player->state.skills[SKILL_DISARM_MAGIC] +
					 player->state.skills[SKILL_DISARM_PHYS]) / 2;
		} else {
			skill = player->state.skills[SKILL_DISARM_MAGIC];
		}
	}

	/* Penalize some conditions */
	if (player->timed[TMD_BLIND] || no_light(player)) {
		skill /= 10;
	}
	if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE]) {
		skill /= 10;
	}

	/* Extract the difficulty */
	diff = skill - obj->pval;

	/* Always have a small chance of success */
	if (diff < 2) diff = 2;

	/* Must find the trap first. */
	if (!obj->known->pval || ignore_item_ok(player, obj)) {
		msg("I don't see any traps.");
	} else if (!is_trapped_chest(obj)) {
		/* Already disarmed/unlocked or no traps */
		msg("The chest is not trapped.");
	} else if (randint0(100) < diff) {
		/* Success (get a lot of experience) */
		msgt(MSG_DISARM, "You have disarmed the chest.");
		player_exp_gain(player, obj->pval);
		obj->pval = (0 - obj->pval);
	} else if (randint0(100) < diff) {
		/* Failure -- Keep trying */
		more = true;
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to disarm the chest.");
	} else {
		/* Failure -- Set off the trap */
		if (!player_is_trapsafe(player)) {
			msg("You set off a trap!");
			chest_trap(obj);
		} else if (player_of_has(player, OF_TRAP_IMMUNE)) {
			/* Learn trap immunity. */
			equip_learn_flag(player, OF_TRAP_IMMUNE);
		}
	}

	/* Result */
	return (more);
}